

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O2

void __thiscall
MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenNames_,RefToken *token_,int lower,int upper_,bool matchNot)

{
  Ref *pRVar1;
  int iVar2;
  undefined3 in_register_00000089;
  allocator local_65;
  int local_64;
  int local_60;
  uint local_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"Mismatched Token",&local_65);
  ParserException::ParserException(&this->super_ParserException,&local_50);
  local_64 = upper_;
  local_60 = lower;
  local_5c = CONCAT31(in_register_00000089,matchNot);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&(this->super_ParserException).super_ANTLRException =
       &PTR__MismatchedTokenException_00213cf8;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = token_->ref;
  if (pRVar1 != (Ref *)0x0) {
    pRVar1->count = pRVar1->count + 1;
  }
  (this->token).ref = pRVar1;
  (this->node).ref = (Ref *)0x0;
  (this->tokenText)._M_dataplus._M_p = (pointer)&(this->tokenText).field_2;
  (this->tokenText)._M_string_length = 0;
  (this->tokenText).field_2._M_local_buf[0] = '\0';
  local_58 = &this->tokenNames;
  BitSet::BitSet(&this->set,0x40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->tokenNames,tokenNames_);
  iVar2 = (*((this->token).ref)->ptr->_vptr_Token[1])();
  (this->super_ParserException).line = iVar2;
  iVar2 = (**((this->token).ref)->ptr->_vptr_Token)();
  (this->super_ParserException).column = iVar2;
  (*((this->token).ref)->ptr->_vptr_Token[2])(&local_50);
  std::__cxx11::string::operator=((string *)&this->tokenText,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this->expecting = local_60;
  this->upper = local_64;
  this->mismatchType = (local_5c & 0xff) + 3;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const std::vector<std::string>& tokenNames_,
	RefToken token_,
	int lower,
	int upper_,
	bool matchNot
) : ParserException("Mismatched Token")
  , token(token_)
  , node(0)
{
	tokenNames = tokenNames_;
	line = token->getLine();
	column = token->getColumn();
	tokenText = token->getText();
	expecting = lower;
	upper = upper_;
	mismatchType = matchNot ? NOT_RANGE : RANGE;
}